

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  int col;
  long lVar7;
  float *pfVar8;
  int col_1;
  float fVar9;
  Matrix<float,_2,_4> retVal;
  float local_48 [4];
  Type in0;
  int aiStack_18 [6];
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pfVar5 = (float *)&in0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        fVar9 = 1.0;
        if (lVar4 != lVar7) {
          fVar9 = 0.0;
        }
        pfVar5[lVar7 * 2] = fVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar4 = 1;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in0.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[3].m_data[0] = 0.0;
    in0.m_data.m_data[3].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    pfVar5 = (float *)&in0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar7 = 0;
      do {
        pfVar5[lVar7 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar4 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar4 = 0x10;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
  }
  pfVar5 = retVal.m_data.m_data[0].m_data + 1;
  lVar4 = 0;
  pfVar6 = (float *)&retVal;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar7 = 0;
    do {
      fVar9 = 1.0;
      if (lVar4 != lVar7) {
        fVar9 = 0.0;
      }
      pfVar6[lVar7 * 2] = fVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar4 = 1;
    pfVar6 = pfVar5;
    bVar2 = false;
  } while (bVar3);
  pfVar6 = (float *)&retVal;
  pfVar8 = (float *)&in0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar4 = 0;
    do {
      pfVar6[lVar4 * 2] = -pfVar8[lVar4 * 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar6 = pfVar5;
    pfVar8 = pfVar1;
    bVar2 = false;
  } while (bVar3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = local_48[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}